

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::ExtensionDirectiveTestCaseGroup::ExtensionDirectiveTestCase::iterate
          (ExtensionDirectiveTestCase *this)

{
  TestLog *log;
  RenderContext *renderCtx;
  glUniform4fFunc p_Var1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  GLint GVar5;
  undefined4 extraout_var;
  char *pcVar6;
  TestError *this_00;
  GLSLVersion glslVersion;
  char *extensionDirective;
  allocator<char> local_282;
  allocator<char> local_281;
  GLubyte result [4];
  int iStack_27c;
  string local_260;
  string local_240;
  string frgSrc;
  string directive;
  FBOSentry fbo;
  ShaderProgram p;
  VertexArrayBinding posBinding;
  Functions *gl;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  bVar2 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar2) {
    extensionDirective = (char *)0x8058;
    FBOSentry::FBOSentry(&fbo,gl,4,4,0x8058);
    (*gl->clearColor)(1.0,1.0,1.0,1.0);
    (*gl->clear)(0x4000);
    std::operator+(&directive,"#extension GL_KHR_blend_equation_advanced : ",&this->m_behaviourStr);
    pcVar6 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              (&frgSrc,(glcts *)"blend_support_multiply",pcVar6,directive._M_dataplus._M_p,
               extensionDirective);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    GetDef2DVtxSrc_abi_cxx11_(&local_260,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)result,local_260._M_dataplus._M_p,&local_281);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,frgSrc._M_dataplus._M_p,&local_282);
    glu::makeVtxFragSources((ProgramSources *)&posBinding,(string *)result,&local_240);
    glu::ShaderProgram::ShaderProgram(&p,renderCtx,(ProgramSources *)&posBinding);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&posBinding);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)result);
    std::__cxx11::string::~string((string *)&local_260);
    bVar2 = true;
    if (this->m_requireInfoLog == true) {
      bVar2 = ((*p.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                 _M_impl.super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length != 0;
    }
    if (p.m_program.m_info.linkOk == false) {
      if (this->m_requireCompile == true) {
        glu::operator<<(log,&p);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Compile failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                   ,0x462);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pcVar6 = "Fail. Expected info log.";
      if (bVar2 != false) {
        pcVar6 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar2 ^ 1),
                 pcVar6);
    }
    else {
      (*gl->useProgram)(p.m_program.m_program);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"Program failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                      ,0x46e);
      if (bVar2 == false) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail. No warnings were generated.");
      }
      else {
        (*gl->disable)(0xbd0);
        (*gl->enable)(0xbe2);
        (*gl->blendEquation)(0x9294);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"BlendEquation failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x47b);
        p_Var1 = gl->uniform4f;
        GVar5 = (*gl->getUniformLocation)(p.m_program.m_program,"uSrcCol");
        (*p_Var1)(GVar5,0.0,0.0,0.0,1.0);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"Uniform failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x480);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)result,"aPos",(allocator<char> *)&local_260);
        glu::va::Float(&posBinding,(string *)result,2,4,0,(float *)s_pos);
        std::__cxx11::string::~string((string *)result);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"Attributes failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x483);
        _result = (pointer)0x600000000;
        glu::draw(((this->super_TestCase).m_context)->m_renderCtx,p.m_program.m_program,1,
                  &posBinding,(PrimitiveList *)result,(DrawUtilCallback *)0x0);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"Draw failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x487);
        result[0] = '\x01';
        result[1] = '\x02';
        result[2] = '\x03';
        result[3] = '\x04';
        (*gl->readPixels)(0,0,1,1,0x1908,0x1401,(PrimitiveList *)result);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"Read pixels failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x48c);
        pcVar6 = "Pass";
        if (result != (GLubyte  [4])0xff000000) {
          pcVar6 = "Fail";
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (uint)(result != (GLubyte  [4])0xff000000),pcVar6);
        std::__cxx11::string::~string((string *)&posBinding.binding.name);
      }
    }
    glu::ShaderProgram::~ShaderProgram(&p);
    std::__cxx11::string::~string((string *)&frgSrc);
    std::__cxx11::string::~string((string *)&directive);
    FBOSentry::~FBOSentry(&fbo);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

IterateResult iterate(void)
		{
			const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
			TestLog&			  log = m_testCtx.getLog();
			const int			  dim = 4;

			// Check that extension is supported.
			if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
				return STOP;
			}

			FBOSentry fbo(gl, dim, dim, GL_RGBA8);

			tcu::Vec4 dstCol(1.f, 1.f, 1.f, 1.f);
			tcu::Vec4 srcCol(0.f, 0.f, 0.f, 1.f);

			// Clear to destination color.
			gl.clearColor(dstCol.x(), dstCol.y(), dstCol.z(), dstCol.w());
			gl.clear(GL_COLOR_BUFFER_BIT);

			// Setup program.
			std::string directive = "#extension GL_KHR_blend_equation_advanced : " + m_behaviourStr;
			std::string frgSrc = GetSolidShader("blend_support_multiply", glu::getGLSLVersionDeclaration(m_glslVersion),
												directive.c_str());
			glu::ShaderProgram p(m_context.getRenderContext(),
								 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
			// If check that there is some info log if it is expected.
			const bool infoLogOk =
				m_requireInfoLog ? p.getShaderInfo(glu::SHADERTYPE_FRAGMENT).infoLog.size() > 0 : true;
			if (!p.isOk())
			{
				if (m_requireCompile)
				{
					log << p;
					TCU_FAIL("Compile failed");
				}
				else
				{
					// If shader was expected to fail, so assume info log has something.
					bool pass = infoLogOk;
					m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
											pass ? "Pass" : "Fail. Expected info log.");
				}
				return STOP;
			}
			gl.useProgram(p.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

			// Program ok, check whether info log was as expected.
			if (!infoLogOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail. No warnings were generated.");
				return STOP;
			}

			// Enable blending and set blend equation.
			gl.disable(GL_DITHER);
			gl.enable(GL_BLEND);
			gl.blendEquation(GL_MULTIPLY_KHR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

			// Setup source color.
			gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol.x(), srcCol.y(), srcCol.z(),
						 srcCol.w());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform failed");

			glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Attributes failed");

			glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

			// Check the result to see that extension was actually enabled.
			glw::GLubyte result[4] = { 1, 2, 3, 4 };
			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, result);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");
			bool pass = tcu::RGBA::fromBytes(result) == tcu::RGBA(0, 0, 0, 0xFF);
			m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");

			return STOP;
		}